

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Uint wabt::anon_unknown_0::FloatParser<float>::ShiftAndRoundToNearest(Uint significand,int shift)

{
  byte bVar1;
  uint local_c;
  int shift_local;
  Uint significand_local;
  
  if (0 < shift) {
    bVar1 = (byte)shift;
    local_c = significand;
    if ((significand & 1 << (bVar1 & 0x1f)) != 0) {
      local_c = (1 << (bVar1 - 1 & 0x1f)) + significand;
    }
    return local_c >> (bVar1 & 0x1f);
  }
  __assert_fail("shift > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/literal.cc"
                ,0xbe,
                "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<float>::ShiftAndRoundToNearest(Uint, int) [T = float]"
               );
}

Assistant:

typename FloatParser<T>::Uint FloatParser<T>::ShiftAndRoundToNearest(
    Uint significand,
    int shift) {
  assert(shift > 0);
  // Round ties to even.
  if (significand & (Uint(1) << shift)) {
    significand += Uint(1) << (shift - 1);
  }
  significand >>= shift;
  return significand;
}